

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

void expand_macro(token *macro_name,Source_File *src,Translation_Data *translation_data)

{
  Queue *args;
  int *piVar1;
  token *ptVar2;
  Queue *argument_list;
  Queue_Node *it;
  int *index;
  token *hold_token;
  define_directive *hold;
  Translation_Data *translation_data_local;
  Source_File *src_local;
  token *macro_name_local;
  
  hold_token = (token *)0x0;
  if (macro_name->type == KW_ID) {
    hold_token = (token *)Map_Check(translation_data->macros,macro_name->data,macro_name->data_size)
    ;
  }
  if (hold_token == (token *)0x0) {
    Queue_Push(translation_data->tokens,macro_name);
  }
  else {
    free(macro_name);
    args = make_define_argument_list(hold_token->line);
    load_macro_arguments(args,hold_token->line,src,translation_data);
    if (translation_data->errors->size == 0) {
      for (argument_list = *(Queue **)hold_token->data_size; argument_list != (Queue *)0x0;
          argument_list = (Queue *)argument_list->last) {
        ptVar2 = (token *)argument_list->first;
        piVar1 = (int *)Map_Check((Map *)hold_token->data,ptVar2->data,ptVar2->data_size);
        if (piVar1 == (int *)0x0) {
          ptVar2 = copy_token(ptVar2);
          ptVar2->line = src->which_row;
          ptVar2->column = src->which_column;
          Queue_Push(translation_data->tokens,ptVar2);
        }
        else {
          expand_macro_argument(args + *piVar1,src,translation_data);
        }
      }
      delete_define_argument_list(hold_token->line,args);
    }
    else {
      delete_define_argument_list(hold_token->line,args);
    }
  }
  return;
}

Assistant:

void expand_macro(struct token* macro_name,struct Source_File *src,struct Translation_Data *translation_data)
{
	struct define_directive *hold=NULL;
	struct token *hold_token;
	int *index;
	struct Queue_Node *it;
	struct Queue *argument_list;

	if(macro_name->type==KW_ID)
		hold=Map_Check(translation_data->macros,macro_name->data,macro_name->data_size);
	if(hold!=NULL)
	{
		free(macro_name);
		argument_list=make_define_argument_list(hold->number_of_arguments);
		load_macro_arguments(argument_list,hold->number_of_arguments,src,translation_data);
		if(translation_data->errors->size>0)
		{
			delete_define_argument_list(hold->number_of_arguments,argument_list);
			return;
		}

		
		for(it=hold->macro_tokens->first;it!=NULL;it=it->prev)
		{
			hold_token=(struct token*)it->data;
			index=Map_Check(hold->arguments,hold_token->data,hold_token->data_size);
			if(index!=NULL)
			{
				expand_macro_argument(argument_list+*index,src,translation_data);
			}else
			{
				hold_token=copy_token(hold_token);

				hold_token->line=src->which_row;
				hold_token->column=src->which_column;

				Queue_Push(translation_data->tokens,hold_token);
			}
		}
		delete_define_argument_list(hold->number_of_arguments,argument_list);
	}else
	{
		/*this isn't a macro, so we just push it to the token queue*/
		Queue_Push(translation_data->tokens,macro_name);
	}
}